

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O1

void duckdb::MapVector::EvalMapInvalidReason(MapInvalidReason reason)

{
  InvalidInputException *pIVar1;
  InternalException *this;
  int iVar2;
  undefined7 in_register_00000039;
  string local_40;
  
  iVar2 = (int)CONCAT71(in_register_00000039,reason);
  if (iVar2 != 0) {
    switch(iVar2) {
    case 1:
      pIVar1 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Map keys can not be NULL.","");
      InvalidInputException::InvalidInputException(pIVar1,&local_40);
      __cxa_throw(pIVar1,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    case 2:
      pIVar1 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Map keys must be unique.","");
      InvalidInputException::InvalidInputException(pIVar1,&local_40);
      __cxa_throw(pIVar1,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    case 3:
      pIVar1 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"The map key list does not align with the map value list.","");
      InvalidInputException::InvalidInputException(pIVar1,&local_40);
      __cxa_throw(pIVar1,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    case 4:
      pIVar1 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,
                 "Invalid map argument(s). Valid map arguments are a list of key-value pairs (MAP {\'key1\': \'val1\', ...}), two lists (MAP ([1, 2], [10, 11])), or no arguments."
                 ,"");
      InvalidInputException::InvalidInputException(pIVar1,&local_40);
      __cxa_throw(pIVar1,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    default:
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"MapInvalidReason not implemented","");
      InternalException::InternalException(this,&local_40);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void MapVector::EvalMapInvalidReason(MapInvalidReason reason) {
	switch (reason) {
	case MapInvalidReason::VALID:
		return;
	case MapInvalidReason::DUPLICATE_KEY:
		throw InvalidInputException("Map keys must be unique.");
	case MapInvalidReason::NULL_KEY:
		throw InvalidInputException("Map keys can not be NULL.");
	case MapInvalidReason::NOT_ALIGNED:
		throw InvalidInputException("The map key list does not align with the map value list.");
	case MapInvalidReason::INVALID_PARAMS:
		throw InvalidInputException("Invalid map argument(s). Valid map arguments are a list of key-value pairs (MAP "
		                            "{'key1': 'val1', ...}), two lists (MAP ([1, 2], [10, 11])), or no arguments.");
	default:
		throw InternalException("MapInvalidReason not implemented");
	}
}